

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adam_benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
  __l;
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  pointer ppVar5;
  rep rVar6;
  char *__name;
  undefined1 auVar7 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  *local_270;
  char *local_230;
  char *local_228;
  function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)> local_220;
  uint local_1fc;
  long lStack_1f8;
  uint i;
  rep total;
  unsigned_long times;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dest;
  undefined1 local_1c0 [8];
  vector<char,_std::allocator<char>_> inBuffer;
  _Self local_1a0;
  iterator it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
  local_c8;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  FuncMap funcMap;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_31);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_30,argv,
             argv + argc,&local_31);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_31);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30);
  if (sVar2 == 4) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[2],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_188,(char (*) [2])"c",testCFileIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[6],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_148,(char (*) [6])"posix",testPosixIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[4],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_108,(char (*) [4])"c++",testCppIO);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
    ::
    pair<const_char_(&)[7],_void_(&)(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&),_true>
              (&local_c8,(char (*) [7])"modern",testModernIO);
    local_88 = &local_188;
    local_80 = 4;
    this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
            *)((long)&it._M_node + 6);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
    ::allocator(this);
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
           *)local_78,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          ((long)&it._M_node + 7),this);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
                  *)((long)&it._M_node + 6));
    local_270 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
                 *)&local_88;
    do {
      local_270 = local_270 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>
      ::~pair(local_270);
    } while (local_270 != &local_188);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,1);
    local_1a0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
                 *)local_78,pvVar4);
    inBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
                *)local_78);
    bVar1 = std::operator!=(&local_1a0,
                            (_Self *)&inBuffer.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.field_0x10);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_1c0,0x100000,
                 (allocator_type *)(dest.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(dest.field_2._M_local_buf + 0xf));
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&times,
                     pvVar4,".copy");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,3);
      total = std::__cxx11::stoul(pvVar4,(size_t *)0x0,10);
      lStack_1f8 = 0;
      for (local_1fc = 0; (ulong)local_1fc < (ulong)total; local_1fc = local_1fc + 1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>
                 ::operator->(&local_1a0);
        std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
        ::function(&local_220,&ppVar5->second);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_30,2);
        local_228 = (char *)std::__cxx11::string::c_str();
        local_230 = (char *)std::__cxx11::string::c_str();
        rVar6 = measure::
                ms<std::function<void(char_const*,char_const*,std::vector<char,std::allocator<char>>&)>,char_const*,char_const*,std::vector<char,std::allocator<char>>&>
                          (&local_220,&local_228,&local_230,
                           (vector<char,_std::allocator<char>_> *)local_1c0);
        lStack_1f8 = rVar6 + lStack_1f8;
        std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>
        ::~function(&local_220);
        __name = (char *)std::__cxx11::string::c_str();
        unlink(__name);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Average ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,1);
      poVar3 = std::operator<<(poVar3,(string *)pvVar4);
      poVar3 = std::operator<<(poVar3," I/O took: ");
      auVar7._8_4_ = (int)((ulong)total >> 0x20);
      auVar7._0_8_ = total;
      auVar7._12_4_ = 0x45300000;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(double)lStack_1f8 /
                                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)total) - 4503599627370496.0)));
      poVar3 = std::operator<<(poVar3,"ms");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&times);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_1c0);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Not supported copy method: ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,1);
      poVar3 = std::operator<<(poVar3,(string *)pvVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_char_*,_const_char_*,_std::vector<char,_std::allocator<char>_>_&)>_>_>_>
            *)local_78);
    funcMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,0);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    poVar3 = std::operator<<(poVar3," copy_method (c, posix, c++) in_file number_of_times");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    funcMap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv, argv + argc);
    if (args.size() != 4)
    {
        std::cout << "Usage: " << args[0] << " copy_method (c, posix, c++) in_file number_of_times" << std::endl;
        return 1;
    }

    typedef std::map<std::string, std::function<void (const char*, const char*, std::vector<char>&)>> FuncMap;
    FuncMap funcMap { {"c", testCFileIO}, {"posix", testPosixIO}, {"c++", testCppIO}, {"modern", testModernIO}};

    auto it = funcMap.find(args[1]);
    if (it != funcMap.end())
    {
        std::vector<char> inBuffer(1024 * 1024);

        auto dest = args[2] + ".copy";
        const auto times = std::stoul(args[3]);

        milliseconds::rep total = 0;
        for (unsigned int i = 0; i < times; ++i)
        {
            total += measure::ms(it->second, args[2].c_str(), dest.c_str(), inBuffer);
            ::unlink(dest.c_str());
        }
        std::cout << "Average " << args[1] << " I/O took: " << total / double(times) << "ms" << std::endl;
    }
    else
    {
        std::cout << "Not supported copy method: " << args[1] << std::endl;
    }
}